

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O2

int drmp3dec_decode_frame
              (drmp3dec *dec,uchar *mp3,int mp3_bytes,void *pcm,drmp3dec_frame_info *info)

{
  drmp3_L3_gr_info *pdVar1;
  float *dst;
  char *pcVar2;
  drmp3_uint8 dVar3;
  drmp3_uint8 dVar4;
  byte bVar5;
  ushort uVar6;
  short sVar7;
  short sVar8;
  drmp3_uint16 dVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined8 uVar23;
  drmp3_uint8 dVar24;
  drmp3_uint8 dVar25;
  byte bVar26;
  int i;
  uint uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  drmp3_uint32 dVar34;
  uint uVar35;
  drmp3_uint32 dVar36;
  drmp3_uint32 dVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  byte bVar41;
  byte bVar42;
  sbyte sVar43;
  bool bVar44;
  uint uVar45;
  uint uVar46;
  float (*pafVar47) [576];
  drmp3dec_scratch *pdVar48;
  bool bVar49;
  float (*pafVar50) [64];
  int iVar51;
  ulong uVar52;
  byte *pbVar53;
  drmp3_L12_scale_info *pdVar54;
  float *pfVar55;
  int iVar56;
  uint uVar57;
  ulong uVar58;
  uint uVar59;
  undefined1 *puVar60;
  void *pvVar61;
  float *pfVar62;
  uint uVar63;
  drmp3dec_scratch *pdVar64;
  void *__dest;
  byte bVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  ulong uVar69;
  uint *puVar70;
  uint uVar71;
  uint uVar72;
  drmp3_uint8 (*__src) [39];
  drmp3_uint8 *pdVar73;
  ulong uVar74;
  int iVar75;
  ulong uVar76;
  ulong uVar77;
  undefined1 *puVar78;
  uint uVar79;
  uchar *puVar80;
  drmp3_uint8 *pdVar81;
  float (*overlap) [288];
  byte bVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float (*local_4400) [576];
  drmp3_uint8 *local_43f0;
  ulong local_43e8;
  drmp3_uint8 scf_size [4];
  uint local_43a8;
  drmp3_bs bs_frame [1];
  ulong local_4380;
  drmp3_L3_gr_info *local_4378;
  drmp3d_sample_t *local_4370;
  drmp3_L12_scale_info sci [1];
  drmp3dec_scratch scratch;
  
  bVar26 = 0;
  if (((4 < mp3_bytes) && (dec->header[0] == 0xff)) &&
     (iVar28 = drmp3_hdr_compare(dec->header,mp3), iVar28 != 0)) {
    iVar28 = drmp3_hdr_frame_bytes(mp3,dec->free_format_bytes);
    iVar56 = drmp3_hdr_padding(mp3);
    iVar56 = iVar56 + iVar28;
    iVar28 = 0;
    iVar30 = mp3_bytes;
    if ((iVar56 == mp3_bytes) ||
       (((iVar56 + 4 <= mp3_bytes && (iVar29 = drmp3_hdr_compare(mp3,mp3 + iVar56), iVar56 != 0)) &&
        (iVar30 = iVar56, iVar29 != 0)))) goto LAB_0010459c;
  }
  iVar56 = 8;
  memset(dec,0,0x1a0c);
  uVar27 = mp3_bytes - 4;
  uVar76 = 0;
  if (0 < (int)uVar27) {
    uVar76 = (ulong)uVar27;
  }
  puVar80 = mp3;
  for (uVar52 = 0; uVar52 != uVar76; uVar52 = uVar52 + 1) {
    iVar28 = drmp3_hdr_valid(puVar80);
    if (iVar28 != 0) {
      iVar29 = drmp3_hdr_frame_bytes(puVar80,0);
      iVar28 = drmp3_hdr_padding(puVar80);
      local_43e8 = (ulong)(uint)(iVar28 + iVar29);
      iVar28 = iVar56;
      for (uVar77 = 4; (iVar30 = (int)local_43e8, iVar29 == 0 && (uVar77 < 0x900));
          uVar77 = uVar77 + 1) {
        if ((int)uVar27 <= iVar28) goto LAB_001044d3;
        pdVar81 = puVar80 + uVar77;
        iVar30 = drmp3_hdr_compare(puVar80,pdVar81);
        iVar29 = 0;
        if (iVar30 != 0) {
          iVar30 = drmp3_hdr_padding(puVar80);
          iVar31 = drmp3_hdr_padding(pdVar81);
          if ((iVar31 - iVar30) + iVar28 + 4 <= mp3_bytes) {
            iVar31 = drmp3_hdr_compare(puVar80,pdVar81 + (uint)((iVar31 + (int)uVar77) - iVar30));
            if (iVar31 != 0) {
              iVar29 = (int)uVar77 - iVar30;
              dec->free_format_bytes = iVar29;
              local_43e8 = uVar77 & 0xffffffff;
            }
          }
        }
        iVar28 = iVar28 + 2;
      }
      if (iVar29 != 0) {
        iVar28 = (int)uVar52;
        iVar31 = iVar28 + iVar30;
        if (iVar31 <= mp3_bytes) {
          iVar51 = 0;
          iVar75 = 0;
          while( true ) {
            if (iVar51 == -10) goto LAB_00104586;
            iVar32 = drmp3_hdr_frame_bytes(puVar80 + iVar75,iVar29);
            iVar33 = drmp3_hdr_padding(puVar80 + iVar75);
            if ((long)((long)mp3_bytes - uVar52) < (long)(iVar33 + iVar75 + iVar32 + 4)) break;
            iVar75 = iVar75 + iVar32 + iVar33;
            iVar32 = drmp3_hdr_compare(puVar80,puVar80 + iVar75);
            if (iVar32 == 0) goto LAB_001044d3;
            iVar51 = iVar51 + -1;
          }
          if (iVar51 != 0) {
            uVar76 = uVar52 & 0xffffffff;
            goto LAB_0010457f;
          }
        }
      }
LAB_001044d3:
      if ((uVar52 == 0) && (iVar30 == mp3_bytes)) {
        uVar76 = 0;
        iVar30 = mp3_bytes;
        goto LAB_0010457f;
      }
      dec->free_format_bytes = 0;
    }
    puVar80 = puVar80 + 1;
    iVar56 = iVar56 + 1;
  }
  iVar30 = 0;
LAB_0010457f:
  iVar28 = (int)uVar76;
  iVar31 = iVar30 + iVar28;
LAB_00104586:
  if ((iVar30 == 0) || (mp3_bytes < iVar31)) {
    info->frame_bytes = iVar28;
    return 0;
  }
LAB_0010459c:
  puVar80 = mp3 + iVar28;
  pdVar81 = mp3 + iVar28;
  *(undefined4 *)dec->header = *(undefined4 *)puVar80;
  info->frame_bytes = iVar28 + iVar30;
  uVar27 = (puVar80[3] < 0xc0) + 1;
  local_4380 = (ulong)uVar27;
  info->channels = uVar27;
  uVar27 = drmp3_hdr_sample_rate_hz(pdVar81);
  info->hz = uVar27;
  uVar57 = puVar80[1] >> 1 & 3;
  info->layer = 4 - uVar57;
  uVar27 = drmp3_hdr_bitrate_kbps(pdVar81);
  info->bitrate_kbps = uVar27;
  bs_frame[0].buf = puVar80 + 4;
  bs_frame[0].pos = 0;
  bs_frame[0].limit = iVar30 * 8 + -0x20;
  bVar42 = puVar80[1];
  if ((bVar42 & 1) == 0) {
    drmp3_bs_get_bits(bs_frame,0x10);
  }
  local_4370 = (drmp3d_sample_t *)pcm;
  if ((char)uVar57 == '\x01') {
    iVar28 = ((bVar42 >> 3 & 1) + (uint)((bVar42 >> 4 & 1) != 0)) * 3 + (pdVar81[2] >> 2 & 3);
    bVar65 = pdVar81[3];
    dVar36 = 0;
    uVar27 = (bVar65 < 0xc0) + 1;
    if ((bVar42 & 8) == 0) {
      dVar34 = drmp3_bs_get_bits(bs_frame,uVar27 | 8);
      uVar35 = dVar34 >> (sbyte)uVar27;
      uVar57 = uVar27;
    }
    else {
      uVar57 = uVar27 * 2;
      uVar35 = drmp3_bs_get_bits(bs_frame,9);
      dVar36 = drmp3_bs_get_bits(bs_frame,uVar27 * 2 + 7);
    }
    lVar38 = (long)(int)(iVar28 + -1 + (uint)(iVar28 == 0));
    iVar28 = 0;
    pdVar73 = &scratch.gr_info[0].scfsi;
    do {
      uVar27 = dVar36 << 4;
      if (bVar65 < 0xc0) {
        uVar27 = dVar36;
      }
      uVar76 = (ulong)uVar27;
      dVar36 = drmp3_bs_get_bits(bs_frame,0xc);
      *(drmp3_uint16 *)(pdVar73 + -0x17) = (drmp3_uint16)dVar36;
      dVar34 = drmp3_bs_get_bits(bs_frame,9);
      *(drmp3_uint16 *)(pdVar73 + -0x15) = (drmp3_uint16)dVar34;
      if (0x120 < (dVar34 & 0xffff)) goto LAB_00105f11;
      dVar34 = drmp3_bs_get_bits(bs_frame,8);
      pdVar73[-0x11] = (byte)dVar34;
      dVar34 = drmp3_bs_get_bits(bs_frame,(uint)((bVar42 & 8) == 0) * 5 + 4);
      *(drmp3_uint16 *)(pdVar73 + -0x13) = (drmp3_uint16)dVar34;
      ((drmp3_L3_gr_info *)(pdVar73 + -0x1f))->sfbtab =
           drmp3_L3_read_side_info_g_scf_long + lVar38 * 0x17;
      *(undefined2 *)(pdVar73 + -0xe) = 0x16;
      dVar34 = drmp3_bs_get_bits(bs_frame,1);
      if (dVar34 == 0) {
        *(undefined2 *)(pdVar73 + -0x10) = 0;
        dVar34 = drmp3_bs_get_bits(bs_frame,0xf);
        dVar37 = drmp3_bs_get_bits(bs_frame,4);
        pdVar73[-9] = (byte)dVar37;
        dVar37 = drmp3_bs_get_bits(bs_frame,3);
        pdVar73[-8] = (byte)dVar37;
        pdVar73[-7] = 0xff;
      }
      else {
        dVar34 = drmp3_bs_get_bits(bs_frame,2);
        pdVar73[-0x10] = (byte)dVar34;
        if ((byte)dVar34 == 0) goto LAB_00105f11;
        dVar34 = drmp3_bs_get_bits(bs_frame,1);
        pdVar73[-0xf] = (byte)dVar34;
        pdVar73[-9] = '\a';
        pdVar73[-8] = 0xff;
        if (pdVar73[-0x10] == 2) {
          bVar41 = 0x1e;
          puVar60 = drmp3_L3_read_side_info_g_scf_mixed;
          bVar82 = ((bVar42 & 8) >> 2) + 6;
          if ((byte)dVar34 == 0) {
            pdVar73[-9] = 8;
            bVar41 = 0x27;
            bVar82 = 0;
            puVar60 = drmp3_L3_read_side_info_g_scf_short;
          }
          uVar76 = (ulong)(uVar27 & 0xf0f);
          ((drmp3_L3_gr_info *)(pdVar73 + -0x1f))->sfbtab = puVar60 + lVar38 * 0x28;
          pdVar73[-0xe] = bVar82;
          pdVar73[-0xd] = bVar41;
        }
        dVar34 = drmp3_bs_get_bits(bs_frame,10);
        dVar34 = dVar34 << 5;
        dVar37 = drmp3_bs_get_bits(bs_frame,3);
        pdVar73[-6] = (byte)dVar37;
        dVar37 = drmp3_bs_get_bits(bs_frame,3);
        pdVar73[-5] = (byte)dVar37;
        dVar37 = drmp3_bs_get_bits(bs_frame,3);
        pdVar73[-4] = (byte)dVar37;
      }
      pdVar73[-0xc] = (byte)(dVar34 >> 10);
      pdVar73[-0xb] = (byte)(dVar34 >> 5) & 0x1f;
      pdVar73[-10] = (byte)dVar34 & 0x1f;
      if ((bVar42 & 8) == 0) {
        bVar82 = 499 < *(ushort *)(pdVar73 + -0x13);
      }
      else {
        dVar34 = drmp3_bs_get_bits(bs_frame,1);
        bVar82 = (byte)dVar34;
      }
      iVar28 = iVar28 + (dVar36 & 0xffff);
      pdVar73[-3] = bVar82;
      dVar36 = drmp3_bs_get_bits(bs_frame,1);
      pdVar73[-2] = (byte)dVar36;
      dVar36 = drmp3_bs_get_bits(bs_frame,1);
      iVar30 = bs_frame[0].pos;
      pdVar73[-1] = (byte)dVar36;
      *pdVar73 = (byte)(uVar76 >> 0xc) & 0xf;
      dVar36 = (int)uVar76 << 4;
      pdVar73 = pdVar73 + 0x20;
      uVar57 = uVar57 - 1;
    } while (uVar57 != 0);
    if ((bs_frame[0].pos <= bs_frame[0].limit && -1 < (int)uVar35) &&
        iVar28 + bs_frame[0].pos <= (int)(bs_frame[0].limit + uVar35 * 8)) {
      uVar27 = dec->reserv;
      uVar57 = uVar35;
      if ((int)uVar27 < (int)uVar35) {
        uVar57 = uVar27;
      }
      uVar71 = 0;
      uVar76 = (ulong)(uVar27 - uVar35);
      if ((int)(uVar27 - uVar35) < 1) {
        uVar76 = 0;
      }
      pdVar73 = scratch.maindata;
      iVar28 = (bs_frame[0].limit - bs_frame[0].pos) / 8;
      memcpy(pdVar73,dec->reserv_buf + uVar76,(long)(int)uVar57);
      memcpy(scratch.maindata + (int)uVar57,bs_frame[0].buf + iVar30 / 8,(long)iVar28);
      scratch.bs.pos = 0;
      scratch.bs.limit = (iVar28 + uVar57) * 8;
      scratch.bs.buf = pdVar73;
      if ((pcm != (void *)0x0) && ((int)uVar35 <= (int)uVar27)) {
        for (uVar57 = 0; uVar57 < 2 - ((bVar42 & 8) == 0); uVar57 = uVar57 + 1) {
          memset(scratch.grbuf,0,0x1200);
          lVar38 = (long)(int)((int)local_4380 * uVar57);
          local_4378 = scratch.gr_info + lVar38;
          uVar76 = local_4380 & 0xffffffff;
          if ((int)local_4380 < 1) {
            uVar76 = 0;
          }
          uVar52 = 0;
LAB_00104b21:
          if (uVar52 != uVar76) {
            lVar39 = (long)scratch.bs.pos;
            pdVar1 = local_4378 + uVar52;
            uVar6 = scratch.gr_info[lVar38 + uVar52].part_23_length;
            puVar60 = drmp3_L3_decode_scalefactors_g_scf_partitions +
                      (((ulong)(scratch.gr_info[lVar38 + uVar52].n_long_sfb == '\0') + 1) -
                      (ulong)(scratch.gr_info[lVar38 + uVar52].n_short_sfb == '\0')) * 0x1c;
            dVar25 = scratch.gr_info[lVar38 + uVar52].scalefac_scale;
            if ((dec->header[1] & 8) == 0) {
              bVar42 = uVar52 != 0 & (dec->header[3] & 0x10) >> 4;
              uVar74 = (ulong)(pdVar1->scalefac_compress >> bVar42);
              uVar77 = 0;
              if (bVar42 != 0) {
                uVar77 = 0xc;
              }
              while( true ) {
                if ((int)uVar74 < 0) break;
                uVar69 = 3;
                uVar58 = 1;
                while( true ) {
                  iVar28 = (int)uVar69;
                  if (iVar28 < 0) break;
                  bVar42 = drmp3_L3_decode_scalefactors_g_mod[(uint)((int)uVar77 + iVar28)];
                  scf_size[uVar69] = (drmp3_uint8)((uVar74 / uVar58) % (ulong)bVar42);
                  uVar58 = (ulong)((int)uVar58 * (uint)bVar42);
                  uVar69 = (ulong)(iVar28 - 1);
                }
                uVar74 = (ulong)(uint)((int)uVar74 - (int)uVar58);
                uVar77 = (ulong)((int)uVar77 + 4);
              }
              puVar60 = puVar60 + uVar77;
              uVar71 = 0xfffffff0;
            }
            else {
              uVar71 = (uint)pdVar1->scfsi;
              scf_size[0] = (byte)drmp3_L3_decode_scalefactors_g_scfc_decode
                                  [pdVar1->scalefac_compress] >> 2;
              scf_size[1] = scf_size[0];
              scf_size[2] = drmp3_L3_decode_scalefactors_g_scfc_decode[pdVar1->scalefac_compress] &
                            3;
              scf_size[3] = scf_size[2];
            }
            lVar39 = lVar39 + (ulong)uVar6;
            __src = scratch.ist_pos + uVar52;
            pdVar54 = sci;
            for (lVar40 = 0; (lVar40 != 4 && (uVar77 = (ulong)(byte)puVar60[lVar40], uVar77 != 0));
                lVar40 = lVar40 + 1) {
              if ((uVar71 & 8) == 0) {
                bVar42 = scf_size[lVar40];
                if (bVar42 == 0) {
                  memset(pdVar54,0,uVar77);
                  memset(__src,0,uVar77);
                }
                else {
                  uVar59 = ~(-1 << (bVar42 & 0x1f));
                  if (-1 < (int)uVar71) {
                    uVar59 = 0xffffffff;
                  }
                  for (uVar74 = 0; uVar77 != uVar74; uVar74 = uVar74 + 1) {
                    dVar36 = drmp3_bs_get_bits(&scratch.bs,(uint)bVar42);
                    dVar24 = (drmp3_uint8)dVar36;
                    *(drmp3_uint8 *)((long)pdVar54->scf + uVar74) = dVar24;
                    if (dVar36 == uVar59) {
                      dVar24 = 0xff;
                    }
                    (*__src)[uVar74] = dVar24;
                  }
                }
              }
              else {
                memcpy(pdVar54,__src,uVar77);
              }
              __src = (drmp3_uint8 (*) [39])(*__src + uVar77);
              pdVar54 = (drmp3_L12_scale_info *)((long)pdVar54->scf + uVar77);
              uVar71 = uVar71 * 2;
            }
            *(undefined1 *)((long)pdVar54->scf + 2) = 0;
            *(undefined2 *)pdVar54->scf = 0;
            uVar77 = (ulong)pdVar1->n_short_sfb;
            if (uVar77 == 0) {
              if (pdVar1->preflag != '\0') {
                for (lVar40 = 0; lVar40 != 10; lVar40 = lVar40 + 1) {
                  pcVar2 = (char *)((long)sci[0].scf + lVar40 + 0xb);
                  *pcVar2 = *pcVar2 + (&drmp3_L3_decode_scalefactors_g_preamp)[lVar40];
                }
              }
            }
            else {
              dVar24 = pdVar1->subblock_gain[0];
              bVar42 = 2 - dVar25;
              dVar3 = pdVar1->subblock_gain[1];
              uVar58 = (ulong)pdVar1->n_long_sfb;
              dVar4 = pdVar1->subblock_gain[2];
              for (uVar74 = 0; uVar74 < uVar77; uVar74 = uVar74 + 3) {
                pcVar2 = (char *)((long)sci[0].scf + uVar74 + uVar58);
                *pcVar2 = *pcVar2 + (dVar24 << (bVar42 & 0x1f));
                pcVar2 = (char *)((long)sci[0].scf + uVar74 + uVar58 + 1);
                *pcVar2 = *pcVar2 + (dVar3 << (bVar42 & 0x1f));
                pcVar2 = (char *)((long)sci[0].scf + uVar74 + uVar58 + 2);
                *pcVar2 = *pcVar2 + (dVar4 << (bVar42 & 0x1f));
              }
            }
            fVar83 = drmp3_L3_ldexp_q2(2048.0,((uint)((dec->header[3] & 0xe0) == 0x60) * 2 -
                                              (uint)pdVar1->global_gain) + 0x102);
            bVar42 = pdVar1->n_long_sfb;
            for (lVar40 = 0; bVar42 + uVar77 != lVar40; lVar40 = lVar40 + 1) {
              fVar84 = drmp3_L3_ldexp_q2(fVar83,(uint)*(byte *)((long)sci[0].scf + lVar40) <<
                                                (dVar25 + 1 & 0x1f));
              scratch.scf[lVar40] = fVar84;
            }
            pafVar47 = scratch.grbuf + uVar52;
            uVar68 = (uint)pdVar1->big_values;
            pbVar53 = pdVar1->sfbtab;
            puVar70 = (uint *)((long)(scratch.bs.buf + scratch.bs.pos / 8) + 4);
            uVar71 = *(uint *)(scratch.bs.buf + scratch.bs.pos / 8);
            uVar71 = (uVar71 >> 0x18 | (uVar71 & 0xff0000) >> 8 | (uVar71 & 0xff00) << 8 |
                     uVar71 << 0x18) << ((byte)scratch.bs.pos & 7);
            uVar59 = scratch.bs.pos | 0xfffffff8;
            fVar83 = 0.0;
            lVar40 = 0;
            pfVar55 = scratch.scf;
            while (0 < (int)uVar68) {
              bVar42 = pdVar1->table_select[lVar40];
              sVar7 = *(short *)(drmp3_L3_huffman_tabindex + (ulong)bVar42 * 2);
              bVar65 = drmp3_L3_huffman_g_linbits[bVar42];
              uVar46 = uVar68;
              uVar72 = (uint)pdVar1->region_count[lVar40];
              do {
                uVar45 = (uint)(*pbVar53 >> 1);
                uVar68 = uVar45;
                if (uVar46 < uVar45) {
                  uVar68 = uVar46;
                }
                fVar83 = *pfVar55;
                do {
                  uVar66 = uVar71 >> 0x1b;
                  uVar63 = 5;
                  while( true ) {
                    sVar8 = *(short *)(drmp3_L3_huffman_tabs + (ulong)uVar66 * 2 + (long)sVar7 * 2);
                    uVar66 = (uint)sVar8;
                    if (-1 < sVar8) break;
                    uVar71 = uVar71 << (sbyte)uVar63;
                    uVar59 = uVar59 + uVar63;
                    uVar63 = uVar66 & 7;
                    uVar66 = (uVar71 >> (-(char)uVar63 & 0x1fU)) - ((int)uVar66 >> 3);
                  }
                  uVar71 = uVar71 << ((byte)((ushort)sVar8 >> 8) & 0x1f);
                  uVar59 = uVar59 + (uVar66 >> 8);
                  for (iVar28 = 0; iVar28 != 2; iVar28 = iVar28 + 1) {
                    uVar63 = uVar66 & 0xf;
                    if (((bVar42 & 0xf0) == 0x10) && (uVar63 == 0xf)) {
                      uVar67 = uVar71 << (bVar65 & 0x1f);
                      for (uVar59 = uVar59 + bVar65; -1 < (int)uVar59; uVar59 = uVar59 - 8) {
                        uVar63 = *puVar70;
                        puVar70 = (uint *)((long)puVar70 + 1);
                        uVar67 = uVar67 | (uint)(byte)uVar63 << ((byte)uVar59 & 0x1f);
                      }
                      uVar71 = uVar71 >> (0x20 - bVar65 & 0x1f);
                      uVar63 = uVar71 + 0xf;
                      if ((int)uVar63 < 0x81) {
                        fVar84 = g_drmp3_pow43[(int)(uVar71 + 0x1f)];
                      }
                      else {
                        uVar71 = uVar63 * 8;
                        if (uVar63 >= 0x400) {
                          uVar71 = uVar63;
                        }
                        uVar79 = uVar71 * 2 & 0x40;
                        fVar84 = (float)(int)((uVar71 & 0x3f) - uVar79) /
                                 (float)(int)((uVar71 & 0x7fffffc0) + uVar79);
                        fVar84 = ((fVar84 * 0.22222222 + 1.3333334) * fVar84 + 1.0) *
                                 g_drmp3_pow43[(ulong)(uVar79 + uVar71 >> 6) + 0x10] *
                                 *(float *)(&DAT_001111f0 + (ulong)(uVar63 < 0x400) * 4);
                      }
                      fVar84 = (float)(int)((int)uVar67 >> 0x1f | 1) * fVar84 * fVar83;
                      uVar71 = uVar67;
                    }
                    else {
                      fVar84 = g_drmp3_pow43[(uVar71 >> 0x1b & 0xfffffff0 | uVar63) ^ 0x10] * fVar83
                      ;
                    }
                    (*pafVar47)[0] = fVar84;
                    uVar71 = uVar71 << (uVar63 != 0);
                    uVar59 = uVar59 + (uVar63 != 0);
                    pafVar47 = (float (*) [576])(*pafVar47 + 1);
                    uVar66 = uVar66 >> 4;
                  }
                  for (; -1 < (int)uVar59; uVar59 = uVar59 - 8) {
                    uVar63 = *puVar70;
                    puVar70 = (uint *)((long)puVar70 + 1);
                    uVar71 = uVar71 | (uint)(byte)uVar63 << ((byte)uVar59 & 0x1f);
                  }
                  uVar68 = uVar68 - 1;
                } while (uVar68 != 0);
                pbVar53 = pbVar53 + 1;
                pfVar55 = pfVar55 + 1;
                uVar68 = uVar46 - uVar45;
              } while ((uVar68 != 0 && (int)uVar45 <= (int)uVar46) &&
                      (bVar44 = 0 < (int)uVar72, uVar46 = uVar68, uVar72 = uVar72 - 1, bVar44));
              lVar40 = lVar40 + 1;
            }
            uVar68 = 1 - uVar68;
            puVar60 = drmp3_L3_huffman_tab33;
            if (pdVar1->count1_table == '\0') {
              puVar60 = drmp3_L3_huffman_tab32;
            }
            do {
              bVar42 = puVar60[uVar71 >> 0x1c];
              if ((bVar42 & 8) == 0) {
                bVar42 = puVar60[(ulong)((uVar71 << 4) >> (-(bVar42 & 3) & 0x1f)) +
                                 (ulong)(bVar42 >> 3)];
              }
              uVar46 = bVar42 & 7;
              sVar43 = (sbyte)uVar46;
              uVar72 = uVar71 << sVar43;
              uVar59 = uVar46 + uVar59;
              if (lVar39 < (long)(int)uVar59 + ((long)puVar70 - (long)scratch.bs.buf) * 8 + -0x18)
              goto LAB_0010527f;
              uVar68 = uVar68 - 1;
              if (uVar68 == 0) {
                bVar65 = *pbVar53;
                if (bVar65 < 2) goto LAB_0010527f;
                pbVar53 = pbVar53 + 1;
                uVar68 = (uint)(bVar65 >> 1);
                fVar83 = *pfVar55;
                pfVar55 = pfVar55 + 1;
              }
              if (0x7f < bVar42) {
                fVar84 = fVar83;
                if ((int)(uVar71 << sVar43) < 0) {
                  fVar84 = -fVar83;
                }
                (*pafVar47)[0] = fVar84;
                uVar59 = uVar59 + 1;
                uVar72 = uVar72 * 2;
              }
              uVar71 = uVar72;
              if ((bVar42 & 0x40) != 0) {
                fVar84 = fVar83;
                if ((int)uVar71 < 0) {
                  fVar84 = -fVar83;
                }
                (*pafVar47)[1] = fVar84;
                uVar71 = uVar71 * 2;
                uVar59 = uVar59 + 1;
              }
              uVar68 = uVar68 - 1;
              if (uVar68 == 0) {
                bVar65 = *pbVar53;
                if (bVar65 < 2) goto LAB_0010527f;
                pbVar53 = pbVar53 + 1;
                uVar68 = (uint)(bVar65 >> 1);
                fVar83 = *pfVar55;
                pfVar55 = pfVar55 + 1;
              }
              if ((bVar42 & 0x20) != 0) {
                fVar84 = fVar83;
                if ((int)uVar71 < 0) {
                  fVar84 = -fVar83;
                }
                (*pafVar47)[2] = fVar84;
                uVar71 = uVar71 * 2;
                uVar59 = uVar59 + 1;
              }
              if ((bVar42 & 0x10) != 0) {
                fVar84 = fVar83;
                if ((int)uVar71 < 0) {
                  fVar84 = -fVar83;
                }
                (*pafVar47)[3] = fVar84;
                uVar71 = uVar71 * 2;
                uVar59 = uVar59 + 1;
              }
              for (; -1 < (int)uVar59; uVar59 = uVar59 - 8) {
                uVar72 = *puVar70;
                puVar70 = (uint *)((long)puVar70 + 1);
                uVar71 = uVar71 | (uint)(byte)uVar72 << ((byte)uVar59 & 0x1f);
              }
              pafVar47 = (float (*) [576])(*pafVar47 + 4);
            } while( true );
          }
          bVar42 = dec->header[3];
          if ((bVar42 & 0x10) == 0) {
            if ((bVar42 & 0xe0) == 0x60) {
              drmp3_L3_midside_stereo(scratch.grbuf[0],0x240);
            }
          }
          else {
            bVar65 = scratch.gr_info[lVar38].n_long_sfb;
            sci[0].scf[2] = -NAN;
            bVar82 = scratch.gr_info[lVar38].n_short_sfb;
            sci[0].scf[0] = -NAN;
            sci[0].scf[1] = -NAN;
            uVar71 = (uint)bVar82 + (uint)bVar65;
            pdVar73 = local_4378->sfbtab;
            pafVar47 = scratch.grbuf + 1;
            for (uVar52 = 0; uVar52 != uVar71; uVar52 = uVar52 + 1) {
              bVar41 = pdVar73[uVar52];
              uVar77 = 0;
              while( true ) {
                if (bVar41 <= uVar77) goto LAB_0010535f;
                if (((*pafVar47)[uVar77] != 0.0) || (NAN((*pafVar47)[uVar77]))) break;
                lVar39 = uVar77 + 1;
                uVar77 = uVar77 + 2;
                if (((*pafVar47)[lVar39] != 0.0) || (NAN((*pafVar47)[lVar39]))) break;
              }
              sci[0].scf[(uVar52 & 0xffffffff) % 3] = (float)uVar52;
LAB_0010535f:
              pafVar47 = (float (*) [576])(*pafVar47 + bVar41);
            }
            if (bVar65 != 0) {
              if ((int)sci[0].scf[1] < (int)sci[0].scf[0]) {
                sci[0].scf[1] = sci[0].scf[0];
              }
              if ((int)sci[0].scf[1] <= (int)sci[0].scf[2]) {
                sci[0].scf[1] = sci[0].scf[2];
              }
              sci[0].scf[2] = sci[0].scf[1];
              sci[0].scf[0] = sci[0].scf[1];
            }
            uVar59 = (uint)(bVar82 != 0) * 2 + 1;
            lVar39 = (long)(int)(uVar71 - uVar59) + -0x59;
            for (uVar52 = 0; uVar52 != uVar59; uVar52 = uVar52 + 1) {
              if ((int)sci[0].scf[uVar52] < (int)(uVar71 + uVar59 * -2 + (int)uVar52)) {
                bVar65 = *(byte *)((long)&scratch + uVar52 + (lVar39 - (ulong)uVar59) + 0x3fb0);
              }
              else {
                bVar65 = (char)(dec->header[1] << 4) >> 7 & 3;
              }
              scratch.ist_pos[1][uVar52 + lVar39 + 0x59] = bVar65;
            }
            pdVar73 = local_4378->sfbtab;
            dVar9 = scratch.gr_info[lVar38 + 1].scalefac_compress;
            bVar65 = dec->header[1];
            bVar82 = 7;
            if ((bVar65 & 8) == 0) {
              bVar82 = 0x40;
            }
            fVar83 = *(float *)(&DAT_001111f8 + (ulong)((bVar42 & 0x20) == 0) * 4);
            uVar71 = 0;
            pafVar47 = scratch.grbuf;
            while( true ) {
              uVar52 = (ulong)uVar71;
              bVar41 = pdVar73[uVar52];
              if ((ulong)bVar41 == 0) break;
              if ((int)sci[0].scf[uVar52 % 3] < (int)uVar71) {
                bVar5 = scratch.ist_pos[1][uVar52];
                if (bVar82 <= bVar5) goto LAB_001054d6;
                if ((bVar65 & 8) == 0) {
                  fVar85 = drmp3_L3_ldexp_q2(1.0,(bVar5 + 1 >> 1) << ((byte)dVar9 & 1));
                  if ((bVar5 & 1) == 0) {
                    fVar84 = fVar85;
                    fVar85 = 1.0;
                  }
                  else {
                    fVar84 = 1.0;
                  }
                }
                else {
                  fVar84 = *(float *)(drmp3_L3_stereo_process_g_pan + (ulong)bVar5 * 8 + 4);
                  fVar85 = *(float *)(drmp3_L3_stereo_process_g_pan + (ulong)bVar5 * 8);
                }
                for (uVar77 = 0; bVar41 != uVar77; uVar77 = uVar77 + 1) {
                  pafVar47[1][uVar77] = fVar84 * fVar83 * (*pafVar47)[uVar77];
                  (*pafVar47)[uVar77] = (*pafVar47)[uVar77] * fVar85 * fVar83;
                }
              }
              else {
LAB_001054d6:
                if ((bVar42 & 0x20) != 0) {
                  drmp3_L3_midside_stereo(*pafVar47,(uint)bVar41);
                }
              }
              pafVar47 = (float (*) [576])(*pafVar47 + pdVar73[uVar52]);
              uVar71 = uVar71 + 1;
            }
          }
          pdVar64 = &scratch;
          for (uVar52 = 0; uVar52 != uVar76; uVar52 = uVar52 + 1) {
            dVar25 = local_4378->mixed_block_flag;
            iVar30 = (uint)(dVar25 != '\0') * 2 <<
                     ((byte)(((dec->header[1] >> 3 & 1) + ((dec->header[1] >> 4 & 1) != 0)) * '\x03'
                            + (dec->header[2] >> 2 & 3)) == '\x02');
            iVar28 = 0x1f;
            if (local_4378->n_short_sfb != '\0') {
              __dest = (void *)((long)scratch.grbuf[uVar52] + (ulong)(uint)(iVar30 * 0x48));
              pbVar53 = local_4378->sfbtab + local_4378->n_long_sfb;
              pafVar50 = scratch.syn;
              pvVar61 = __dest;
              while( true ) {
                uVar77 = (ulong)*pbVar53;
                if (uVar77 == 0) break;
                uVar71 = (uint)*pbVar53 * 4;
                for (lVar38 = 0; uVar71 != (uint)lVar38; lVar38 = lVar38 + 4) {
                  (*pafVar50)[0] = *(float *)((long)pvVar61 + lVar38);
                  (*pafVar50)[1] = *(float *)((long)pvVar61 + lVar38 + (ulong)uVar71);
                  (*pafVar50)[2] = *(float *)((long)pvVar61 + lVar38 + uVar77 * 8);
                  pafVar50 = (float (*) [64])(*pafVar50 + 3);
                }
                pbVar53 = pbVar53 + 3;
                pvVar61 = (void *)((long)pvVar61 + lVar38 + uVar77 * 8);
              }
              iVar28 = iVar30 + -1;
              memcpy(__dest,scratch.syn,(long)pafVar50 - (long)scratch.syn);
            }
            local_4400 = scratch.grbuf + uVar52;
            pafVar47 = local_4400;
            for (; 0 < iVar28; iVar28 = iVar28 + -1) {
              lVar38 = 0;
              bVar44 = true;
              do {
                bVar49 = bVar44;
                pfVar55 = *pafVar47 + lVar38 + 0x12;
                fVar83 = *pfVar55;
                fVar84 = pfVar55[1];
                fVar85 = pfVar55[2];
                fVar10 = pfVar55[3];
                fVar11 = *(float *)((long)pafVar47 + (0xe - lVar38) * 4);
                fVar12 = *(float *)((long)pafVar47 + (0xf - lVar38) * 4);
                fVar13 = *(float *)((long)pafVar47 + (0x10 - lVar38) * 4);
                fVar14 = *(float *)((long)pafVar47 + (0x11 - lVar38) * 4);
                lVar39 = lVar38 * 4;
                fVar15 = *(float *)(drmp3_L3_antialias_g_aa + lVar39);
                fVar16 = *(float *)(drmp3_L3_antialias_g_aa + lVar39 + 4);
                fVar17 = *(float *)(drmp3_L3_antialias_g_aa + lVar39 + 8);
                fVar18 = *(float *)(drmp3_L3_antialias_g_aa + lVar39 + 0xc);
                lVar39 = lVar38 * 4;
                fVar19 = *(float *)(drmp3_L3_antialias_g_aa + lVar39 + 0x20);
                fVar20 = *(float *)(drmp3_L3_antialias_g_aa + lVar39 + 0x24);
                fVar21 = *(float *)(drmp3_L3_antialias_g_aa + lVar39 + 0x28);
                fVar22 = *(float *)(drmp3_L3_antialias_g_aa + lVar39 + 0x2c);
                pfVar55 = *pafVar47 + lVar38 + 0x12;
                *pfVar55 = fVar83 * fVar15 - fVar14 * fVar19;
                pfVar55[1] = fVar84 * fVar16 - fVar13 * fVar20;
                pfVar55[2] = fVar85 * fVar17 - fVar12 * fVar21;
                pfVar55[3] = fVar10 * fVar18 - fVar11 * fVar22;
                *(float *)((long)pafVar47 + (0xe - lVar38) * 4) = fVar11 * fVar18 + fVar10 * fVar22;
                *(float *)((long)pafVar47 + (0xf - lVar38) * 4) = fVar12 * fVar17 + fVar85 * fVar21;
                *(float *)((long)pafVar47 + (0x10 - lVar38) * 4) = fVar13 * fVar16 + fVar84 * fVar20
                ;
                *(float *)((long)pafVar47 + (0x11 - lVar38) * 4) = fVar14 * fVar15 + fVar83 * fVar19
                ;
                lVar38 = 4;
                bVar44 = false;
              } while (bVar49);
              pafVar47 = (float (*) [576])(*pafVar47 + 0x12);
            }
            overlap = dec->mdct_overlap + uVar52;
            dVar24 = local_4378->block_type;
            if (dVar25 != '\0') {
              drmp3_L3_imdct36(*local_4400,*overlap,(float *)drmp3_L3_imdct_gr_g_mdct_window,iVar30)
              ;
              local_4400 = (float (*) [576])((long)*local_4400 + (ulong)(uint)(iVar30 * 0x48));
              overlap = (float (*) [288])((long)*overlap + (ulong)(uint)(iVar30 * 0x24));
            }
            if (dVar24 == '\x02') {
              lVar38 = 0;
              for (iVar30 = 0x20 - iVar30; 0 < iVar30; iVar30 = iVar30 + -1) {
                pfVar55 = (float *)((long)*local_4400 + lVar38 * 2);
                dst = (float *)((long)*overlap + lVar38);
                pfVar62 = pfVar55;
                pdVar54 = sci;
                for (lVar39 = 0x12; lVar39 != 0; lVar39 = lVar39 + -1) {
                  pdVar54->scf[0] = *pfVar62;
                  pfVar62 = pfVar62 + (ulong)bVar26 * -2 + 1;
                  pdVar54 = (drmp3_L12_scale_info *)((long)pdVar54 + (ulong)bVar26 * -8 + 4);
                }
                *(undefined8 *)(pfVar55 + 4) = *(undefined8 *)(dst + 4);
                uVar23 = *(undefined8 *)(dst + 2);
                *(undefined8 *)pfVar55 = *(undefined8 *)dst;
                *(undefined8 *)(pfVar55 + 2) = uVar23;
                pfVar62 = dst + 6;
                drmp3_L3_imdct12(sci[0].scf,pfVar55 + 6,pfVar62);
                drmp3_L3_imdct12(sci[0].scf + 1,pfVar55 + 0xc,pfVar62);
                drmp3_L3_imdct12(sci[0].scf + 2,dst,pfVar62);
                lVar38 = lVar38 + 0x24;
              }
            }
            else {
              drmp3_L3_imdct36(*local_4400,*overlap,
                               (float *)(drmp3_L3_imdct_gr_g_mdct_window +
                                        (ulong)(dVar24 == '\x03') * 0x48),0x20 - iVar30);
            }
            pdVar48 = pdVar64;
            for (uVar71 = 0; uVar71 < 0x20; uVar71 = uVar71 + 2) {
              for (lVar38 = 0x2f7; lVar38 - 0x2f6U < 0x12; lVar38 = lVar38 + 2) {
                *(uint *)(pdVar48->maindata + lVar38 * 4 + -0x10) =
                     *(uint *)(pdVar48->maindata + lVar38 * 4 + -0x10) ^ 0x80000000;
              }
              pdVar48 = (drmp3dec_scratch *)(pdVar48->maindata + 0x80);
            }
            local_4378 = local_4378 + 1;
            pdVar64 = (drmp3dec_scratch *)(pdVar64->maindata + 0x8f0);
          }
          drmp3d_synth_granule
                    (dec->qmf_state,scratch.grbuf[0],0x12,info->channels,local_4370,scratch.syn[0]);
          local_4380 = (ulong)info->channels;
          local_4370 = local_4370 + local_4380 * 0x240;
          bVar42 = pdVar81[1];
        }
        uVar71 = scratch.bs.pos + 7U >> 3;
      }
      uVar59 = ((uint)scratch.bs.limit >> 3) - uVar71;
      uVar57 = 0x1ff;
      if ((int)uVar59 < 0x1ff) {
        uVar57 = uVar59;
      }
      if (0 < (int)uVar59) {
        if (0x1ff < uVar59) {
          uVar71 = ((uint)scratch.bs.limit >> 3) - 0x1ff;
        }
        memcpy(dec->reserv_buf,scratch.maindata + uVar71,(ulong)uVar57);
      }
      dec->reserv = uVar57;
      uVar27 = (uint)((int)uVar35 <= (int)uVar27);
LAB_00105a53:
      uVar57 = drmp3_hdr_frame_samples(dec->header);
      return uVar57 * uVar27;
    }
  }
  else {
    if (pcm == (void *)0x0) {
      uVar27 = drmp3_hdr_frame_samples(pdVar81);
      return uVar27;
    }
    uVar27 = 0x20;
    bVar26 = pdVar81[3] >> 6;
    if (bVar26 == 3) {
      uVar57 = 0;
    }
    else {
      uVar57 = uVar27;
      if (bVar26 == 1) {
        uVar57 = (pdVar81[3] >> 2 & 0xc) + 4;
      }
    }
    if ((~bVar42 & 6) == 0) {
      puVar60 = &drmp3_L12_subband_alloc_table_g_alloc_L1;
    }
    else if ((bVar42 & 8) == 0) {
      puVar60 = &drmp3_L12_subband_alloc_table_g_alloc_L2M2;
      uVar27 = 0x1e;
    }
    else {
      bVar65 = pdVar81[2] >> 2 & 3;
      uVar35 = drmp3_hdr_bitrate_kbps(pdVar81);
      uVar27 = 0xc0;
      if (uVar35 >> (bVar26 != 3) != 0) {
        uVar27 = uVar35 >> (bVar26 != 3);
      }
      if (uVar27 < 0x38) {
        uVar27 = (uint)(bVar65 == 2) * 4 + 8;
        puVar60 = (undefined1 *)&drmp3_L12_subband_alloc_table_g_alloc_L2M1_lowrate;
      }
      else {
        bVar44 = bVar65 != 1 && 0x5f < uVar27;
        uVar27 = (uint)bVar44 + (uint)bVar44 * 2 + 0x1b;
        puVar60 = drmp3_L12_subband_alloc_table_g_alloc_L2M1;
      }
    }
    local_43f0 = sci[0].bitalloc;
    sci[0].total_bands = (drmp3_uint8)uVar27;
    uVar35 = uVar27;
    if (uVar57 < uVar27) {
      uVar35 = uVar57;
    }
    uVar76 = (ulong)uVar35;
    sci[0].stereo_bands = (drmp3_uint8)uVar35;
    puVar78 = drmp3_L12_read_scale_info_g_bitalloc_code_tab;
    uVar52 = 0;
    uVar35 = 0;
    for (uVar77 = 0; uVar27 != uVar77; uVar77 = uVar77 + 1) {
      if (uVar77 == uVar52) {
        uVar52 = (ulong)((int)uVar52 + (uint)(byte)puVar60[2]);
        uVar35 = (uint)(byte)puVar60[1];
        puVar78 = drmp3_L12_read_scale_info_g_bitalloc_code_tab + (byte)*puVar60;
        puVar60 = puVar60 + 3;
      }
      dVar36 = drmp3_bs_get_bits(bs_frame,uVar35);
      dVar25 = puVar78[dVar36];
      sci[0].bitalloc[uVar77 * 2] = dVar25;
      if (uVar77 < uVar76) {
        dVar36 = drmp3_bs_get_bits(bs_frame,uVar35);
        dVar25 = puVar78[dVar36];
      }
      if (uVar57 == 0) {
        dVar25 = '\0';
      }
      sci[0].bitalloc[uVar77 * 2 + 1] = dVar25;
    }
    for (uVar52 = 0; uVar27 * 2 != uVar52; uVar52 = uVar52 + 1) {
      bVar26 = (sci[0].bitalloc[uVar52] == '\0') << 2 | 2;
      if ((sci[0].bitalloc[uVar52] != '\0') && ((bVar42 & 6) != 6)) {
        dVar36 = drmp3_bs_get_bits(bs_frame,2);
        bVar26 = (byte)dVar36;
      }
      sci[0].scfcod[uVar52] = bVar26;
    }
    pdVar54 = sci;
    for (uVar52 = 0; uVar52 != uVar27 * 2; uVar52 = uVar52 + 1) {
      bVar26 = *local_43f0;
      if (bVar26 == 0) {
        uVar57 = 0;
      }
      else {
        uVar57 = 0x13U >> (sci[0].scfcod[uVar52] & 0x1f) | 4;
      }
      local_43f0 = local_43f0 + 1;
      fVar83 = 0.0;
      for (uVar35 = 4; uVar35 != 0; uVar35 = uVar35 >> 1) {
        if ((uVar35 & uVar57) != 0) {
          dVar36 = drmp3_bs_get_bits(bs_frame,6);
          fVar83 = (float)(int)(0x200000 >> ((byte)((int)dVar36 / 3) & 0x1f)) *
                   *(float *)(drmp3_L12_read_scalefactors_g_deq_L12 +
                             (long)(int)((int)dVar36 % 3 + (uint)bVar26 + (uint)bVar26 * 2 + -6) * 4
                             );
        }
        pdVar54->scf[0] = fVar83;
        pdVar54 = (drmp3_L12_scale_info *)(pdVar54->scf + 1);
      }
    }
    for (; uVar27 != uVar76; uVar76 = uVar76 + 1) {
      sci[0].bitalloc[uVar76 * 2 + 1] = '\0';
    }
    memset(scratch.grbuf,0,0x1200);
    lVar38 = 0;
    iVar28 = 0;
    do {
      dVar25 = sci[0].total_bands;
      uVar27 = 1;
      if (lVar38 == 3) goto LAB_00105a53;
      uVar76 = (long)info->layer | 1;
      iVar30 = (int)uVar76;
      uVar52 = 0;
      if (0 < iVar30) {
        uVar52 = (ulong)(uint)info->layer | 1;
      }
      uVar77 = (ulong)sci[0].total_bands;
      uVar27 = (uint)sci[0].total_bands;
      iVar56 = 0x240;
      for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
        pfVar55 = scratch.grbuf[0] + (long)iVar28 + lVar39 * uVar76;
        for (uVar74 = 0; uVar74 != uVar27 * 2; uVar74 = uVar74 + 1) {
          bVar26 = sci[0].bitalloc[uVar74];
          if (bVar26 != 0) {
            if (bVar26 < 0x11) {
              for (uVar58 = 0; uVar52 != uVar58; uVar58 = uVar58 + 1) {
                dVar36 = drmp3_bs_get_bits(bs_frame,(uint)bVar26);
                pfVar55[uVar58] = (float)(int)(dVar36 + (-1 << (bVar26 - 1 & 0x1f)) + 1);
              }
            }
            else {
              uVar57 = 2 << (bVar26 - 0x11 & 0x1f);
              dVar36 = drmp3_bs_get_bits(bs_frame,(uVar57 - (uVar57 >> 3)) + 3);
              for (uVar58 = 0; uVar52 != uVar58; uVar58 = uVar58 + 1) {
                pfVar55[uVar58] = (float)(int)(dVar36 % (uVar57 + 1) - (uVar57 >> 1));
                dVar36 = dVar36 / (uVar57 + 1);
              }
            }
          }
          pfVar55 = pfVar55 + iVar56;
          iVar56 = 0x12 - iVar56;
        }
      }
      iVar28 = iVar28 + iVar30 * 4;
      if (iVar28 == 0xc) {
        pfVar55 = sci[0].scf + lVar38;
        pafVar47 = scratch.grbuf;
        memcpy((void *)((long)scratch.grbuf[1] + (ulong)((uint)sci[0].stereo_bands * 0x48)),
               (void *)((long)*pafVar47 + (ulong)((uint)sci[0].stereo_bands * 0x48)),
               (uVar77 - sci[0].stereo_bands) * 0x48);
        for (uVar27 = 0; local_43a8 = (uint)dVar25, uVar27 != local_43a8; uVar27 = uVar27 + 1) {
          fVar83 = *pfVar55;
          fVar84 = pfVar55[3];
          for (lVar39 = 0; lVar39 != 0xc; lVar39 = lVar39 + 1) {
            (*pafVar47)[lVar39] = (*pafVar47)[lVar39] * fVar83;
            pafVar47[1][lVar39] = pafVar47[1][lVar39] * fVar84;
          }
          pafVar47 = (float (*) [576])(*pafVar47 + 0x12);
          pfVar55 = pfVar55 + 6;
        }
        drmp3d_synth_granule
                  (dec->qmf_state,scratch.grbuf[0],0xc,(int)local_4380,local_4370,scratch.syn[0]);
        iVar28 = 0;
        memset(scratch.grbuf,0,0x1200);
        local_4380 = (ulong)info->channels;
        local_4370 = local_4370 + local_4380 * 0x180;
      }
      lVar38 = lVar38 + 1;
    } while (bs_frame[0].pos <= bs_frame[0].limit);
  }
LAB_00105f11:
  dec->header[0] = '\0';
  return 0;
LAB_0010527f:
  scratch.bs.pos = (int)lVar39;
  uVar52 = uVar52 + 1;
  goto LAB_00104b21;
}

Assistant:

int drmp3dec_decode_frame(drmp3dec *dec, const unsigned char *mp3, int mp3_bytes, void *pcm, drmp3dec_frame_info *info)
{
    int i = 0, igr, frame_size = 0, success = 1;
    const drmp3_uint8 *hdr;
    drmp3_bs bs_frame[1];
    drmp3dec_scratch scratch;

    if (mp3_bytes > 4 && dec->header[0] == 0xff && drmp3_hdr_compare(dec->header, mp3))
    {
        frame_size = drmp3_hdr_frame_bytes(mp3, dec->free_format_bytes) + drmp3_hdr_padding(mp3);
        if (frame_size != mp3_bytes && (frame_size + DRMP3_HDR_SIZE > mp3_bytes || !drmp3_hdr_compare(mp3, mp3 + frame_size)))
        {
            frame_size = 0;
        }
    }
    if (!frame_size)
    {
        memset(dec, 0, sizeof(drmp3dec));
        i = drmp3d_find_frame(mp3, mp3_bytes, &dec->free_format_bytes, &frame_size);
        if (!frame_size || i + frame_size > mp3_bytes)
        {
            info->frame_bytes = i;
            return 0;
        }
    }

    hdr = mp3 + i;
    memcpy(dec->header, hdr, DRMP3_HDR_SIZE);
    info->frame_bytes = i + frame_size;
    info->channels = DRMP3_HDR_IS_MONO(hdr) ? 1 : 2;
    info->hz = drmp3_hdr_sample_rate_hz(hdr);
    info->layer = 4 - DRMP3_HDR_GET_LAYER(hdr);
    info->bitrate_kbps = drmp3_hdr_bitrate_kbps(hdr);

    drmp3_bs_init(bs_frame, hdr + DRMP3_HDR_SIZE, frame_size - DRMP3_HDR_SIZE);
    if (DRMP3_HDR_IS_CRC(hdr))
    {
        drmp3_bs_get_bits(bs_frame, 16);
    }

    if (info->layer == 3)
    {
        int main_data_begin = drmp3_L3_read_side_info(bs_frame, scratch.gr_info, hdr);
        if (main_data_begin < 0 || bs_frame->pos > bs_frame->limit)
        {
            drmp3dec_init(dec);
            return 0;
        }
        success = drmp3_L3_restore_reservoir(dec, bs_frame, &scratch, main_data_begin);
        if (success && pcm != NULL)
        {
            for (igr = 0; igr < (DRMP3_HDR_TEST_MPEG1(hdr) ? 2 : 1); igr++, pcm = DRMP3_OFFSET_PTR(pcm, sizeof(drmp3d_sample_t)*576*info->channels))
            {
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                drmp3_L3_decode(dec, &scratch, scratch.gr_info + igr*info->channels, info->channels);
                drmp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 18, info->channels, (drmp3d_sample_t*)pcm, scratch.syn[0]);
            }
        }
        drmp3_L3_save_reservoir(dec, &scratch);
    } else
    {
#ifdef DR_MP3_ONLY_MP3
        return 0;
#else
        if (pcm == NULL) {
            return drmp3_hdr_frame_samples(hdr);
        }

        drmp3_L12_scale_info sci[1];
        drmp3_L12_read_scale_info(hdr, bs_frame, sci);

        memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
        for (i = 0, igr = 0; igr < 3; igr++)
        {
            if (12 == (i += drmp3_L12_dequantize_granule(scratch.grbuf[0] + i, bs_frame, sci, info->layer | 1)))
            {
                i = 0;
                drmp3_L12_apply_scf_384(sci, sci->scf + igr, scratch.grbuf[0]);
                drmp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 12, info->channels, (drmp3d_sample_t*)pcm, scratch.syn[0]);
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                pcm = DRMP3_OFFSET_PTR(pcm, sizeof(drmp3d_sample_t)*384*info->channels);
            }
            if (bs_frame->pos > bs_frame->limit)
            {
                drmp3dec_init(dec);
                return 0;
            }
        }
#endif
    }

    return success*drmp3_hdr_frame_samples(dec->header);
}